

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O2

void __thiscall CTxMemPoolEntry::UpdateModifiedFee(CTxMemPoolEntry *this,CAmount fee_diff)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = SaturatingAdd<long>(this->nModFeesWithDescendants,fee_diff);
  this->nModFeesWithDescendants = lVar1;
  lVar1 = SaturatingAdd<long>(this->nModFeesWithAncestors,fee_diff);
  this->nModFeesWithAncestors = lVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    lVar2 = SaturatingAdd<long>(this->m_modified_fee,fee_diff);
    this->m_modified_fee = lVar2;
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UpdateModifiedFee(CAmount fee_diff)
    {
        nModFeesWithDescendants = SaturatingAdd(nModFeesWithDescendants, fee_diff);
        nModFeesWithAncestors = SaturatingAdd(nModFeesWithAncestors, fee_diff);
        m_modified_fee = SaturatingAdd(m_modified_fee, fee_diff);
    }